

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLap_K.H
# Opt level: O0

void amrex::mlndlap_fillbc_cc<int>
               (Box *vbx,Array4<int> *sigma,Box *domain,GpuArray<amrex::LinOpBCType,_3U> bclo,
               GpuArray<amrex::LinOpBCType,_3U> bchi)

{
  GpuArray<bool,_3U> bfhi;
  GpuArray<bool,_3U> bflo;
  GpuArray<bool,_3U> *in_stack_00000048;
  GpuArray<bool,_3U> *in_stack_00000050;
  Box *in_stack_00000058;
  Array4<int> *in_stack_00000060;
  Box *in_stack_00000068;
  undefined1 local_68 [12];
  undefined4 local_5c;
  Box **local_58;
  undefined4 local_4c;
  Box **local_48;
  undefined4 local_3c;
  Box **local_38;
  undefined4 local_2c;
  undefined1 *local_28;
  undefined4 local_1c;
  undefined1 *local_18;
  undefined4 local_c;
  undefined1 *local_8;
  
  local_58 = &domain;
  local_8 = local_68;
  local_c = 0;
  local_18 = local_68;
  local_1c = 1;
  local_28 = local_68;
  local_2c = 2;
  local_3c = 0;
  local_4c = 1;
  local_5c = 2;
  local_48 = local_58;
  local_38 = local_58;
  mlndlap_bc_doit<int>
            (in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000050,
             in_stack_00000048);
  return;
}

Assistant:

void mlndlap_fillbc_cc (Box const& vbx, Array4<T> const& sigma, Box const& domain,
                        GpuArray<LinOpBCType, AMREX_SPACEDIM> bclo,
                        GpuArray<LinOpBCType, AMREX_SPACEDIM> bchi) noexcept
{
    GpuArray<bool,AMREX_SPACEDIM> bflo{{AMREX_D_DECL(bclo[0] != LinOpBCType::Periodic,
                                                     bclo[1] != LinOpBCType::Periodic,
                                                     bclo[2] != LinOpBCType::Periodic)}};
    GpuArray<bool,AMREX_SPACEDIM> bfhi{{AMREX_D_DECL(bchi[0] != LinOpBCType::Periodic,
                                                     bchi[1] != LinOpBCType::Periodic,
                                                     bchi[2] != LinOpBCType::Periodic)}};
    mlndlap_bc_doit(vbx, sigma, domain, bflo, bfhi);
}